

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPSocket.cpp
# Opt level: O1

void net_uv::KCPSocket::uv_on_after_read
               (uv_udp_t *handle,ssize_t nread,uv_buf_t *buf,sockaddr *addr,uint flags)

{
  char *pcVar1;
  
  if (nread < 0) {
    pcVar1 = uv_err_name((int)nread);
    net_uvLog(3,"udp read error %s\n",pcVar1);
  }
  else if (nread != 0 && addr != (sockaddr *)0x0) {
    onUdpRead((KCPSocket *)handle->data,handle,nread,buf,addr,flags);
  }
  Socket::uv_on_free_buffer((uv_handle_t *)handle,buf);
  return;
}

Assistant:

void KCPSocket::uv_on_after_read(uv_udp_t* handle, ssize_t nread, const uv_buf_t* buf, const struct sockaddr* addr, unsigned flags)
{
	if (nread < 0)
	{
		NET_UV_LOG(NET_UV_L_ERROR, "udp read error %s\n", uv_err_name(nread));
		uv_on_free_buffer((uv_handle_t*)handle, buf);
		return;
	}
	if (addr == NULL)
	{
		//NET_UV_LOG(NET_UV_L_ERROR, "null pointer");
		uv_on_free_buffer((uv_handle_t*)handle, buf);
		return;
	}

	if (nread > 0)
	{
		KCPSocket* s = (KCPSocket*)handle->data;
		s->onUdpRead(handle, nread, buf, addr, flags);
	}
	uv_on_free_buffer((uv_handle_t*)handle, buf);
}